

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall dgrminer::PartialUnion::outputEncodingToFile(PartialUnion *this,string *filename)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  ofstream myfile;
  
  std::ofstream::ofstream((string *)&myfile);
  std::ofstream::open((string *)&myfile,(_Ios_Openmode)filename);
  poVar1 = std::operator<<((ostream *)&myfile,"label,label_int,is_change,label_int_prev");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var3 = (this->labelEncoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->labelEncoding)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar1 = std::operator<<((ostream *)&myfile,"\"");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var3 + 1));
    poVar1 = std::operator<<(poVar1,"\",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var3[2]._M_color);
    poVar1 = std::operator<<(poVar1,",");
    std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::operator[]
              (&this->labelIsChange,(key_type *)(p_Var3 + 2));
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,",");
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->antecedentLabelsOfLabels,(key_type *)(p_Var3 + 2));
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pmVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&myfile);
  return;
}

Assistant:

void PartialUnion::outputEncodingToFile(string filename)
	{
		ofstream myfile;

		myfile.open(filename);

		myfile << "label,label_int,is_change,label_int_prev" << endl;
		for (std::map<std::string, int>::iterator it = labelEncoding.begin(); it != labelEncoding.end(); ++it)
		{
			myfile << "\"" << it->first << "\"," << it->second << "," << labelIsChange[it->second] << "," << antecedentLabelsOfLabels[it->second] << endl;
		}

		myfile.close();
	}